

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::removeClause(SimpSolver *this,CRef cr)

{
  int iVar1;
  int iVar2;
  Lit p;
  int *piVar3;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Clause *pCStack_20;
  int i;
  Clause *c;
  SimpSolver *pSStack_10;
  CRef cr_local;
  SimpSolver *this_local;
  
  c._4_4_ = cr;
  pSStack_10 = this;
  pCStack_20 = ClauseAllocator::operator[](&(this->super_Solver).ca,cr);
  if ((this->use_simplification & 1U) != 0) {
    for (local_24 = 0; iVar2 = local_24, iVar1 = Clause::size(pCStack_20), iVar2 < iVar1;
        local_24 = local_24 + 1) {
      local_28 = (int)Clause::operator[](pCStack_20,local_24);
      piVar3 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                         (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
                          (Lit)local_28);
      *piVar3 = *piVar3 + -1;
      local_2c = (int)Clause::operator[](pCStack_20,local_24);
      iVar2 = var((Lit)local_2c);
      updateElimHeap(this,iVar2);
      p = Clause::operator[](pCStack_20,local_24);
      local_30 = var(p);
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::smudge(&this->occurs,&local_30);
    }
  }
  Solver::removeClause(&this->super_Solver,c._4_4_);
  return;
}

Assistant:

void SimpSolver::removeClause(CRef cr)
{
    const Clause& c = ca[cr];

    if (use_simplification)
        for (int i = 0; i < c.size(); i++){
            n_occ[c[i]]--;
            updateElimHeap(var(c[i]));
            occurs.smudge(var(c[i]));
        }

    Solver::removeClause(cr);
}